

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotHeatmap<double>
               (char *label_id,double *values,int rows,int cols,double scale_min,double scale_max,
               char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  TransformerLinLin transformer;
  ImPlotContext *pIVar1;
  bool bVar2;
  ImDrawList *DrawList;
  
  if ((scale_min == scale_max) && (!NAN(scale_min) && !NAN(scale_max))) {
    __assert_fail("(scale_min != scale_max) && \"Scale values must be different!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/implot/implot_items.cpp"
                  ,0x6a8,
                  "void ImPlot::PlotHeatmap(const char *, const T *, int, int, double, double, const char *, const ImPlotPoint &, const ImPlotPoint &) [T = double]"
                 );
  }
  bVar2 = BeginItem(label_id,-1);
  if (bVar2) {
    if (GImPlot->FitThisFrame == true) {
      FitPoint(bounds_min);
      FitPoint(bounds_max);
    }
    DrawList = GetPlotDrawList();
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      RenderHeatmap<double,ImPlot::TransformerLinLin>
                (transformer,DrawList,values,rows,cols,scale_min,scale_max,fmt,bounds_min,bounds_max
                );
      break;
    case 1:
      RenderHeatmap<double,ImPlot::TransformerLogLin>
                ((TransformerLogLin)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
                 fmt,bounds_min,bounds_max);
      break;
    case 2:
      RenderHeatmap<double,ImPlot::TransformerLinLog>
                ((TransformerLinLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
                 fmt,bounds_min,bounds_max);
      break;
    case 3:
      RenderHeatmap<double,ImPlot::TransformerLogLog>
                ((TransformerLogLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
                 fmt,bounds_min,bounds_max);
    }
    pIVar1 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar1->NextItemData);
    pIVar1->PreviousItem = pIVar1->CurrentItem;
    pIVar1->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    IM_ASSERT_USER_ERROR(scale_min != scale_max, "Scale values must be different!");
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max); break;
        }
        EndItem();
    }
}